

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jasper.c
# Opt level: O3

int main(int argc,char **argv)

{
  int *piVar1;
  bool bVar2;
  int extraout_EAX;
  int iVar3;
  uint uVar4;
  undefined4 uVar5;
  char *pcVar6;
  cmdopts_t *__ptr;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 *puVar12;
  ulonglong uVar13;
  ulong extraout_RAX;
  char *pcVar14;
  ulong uVar15;
  void *__ptr_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar16;
  jas_tmr_t enctmr;
  jas_tmr_t dectmr;
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  
  pcVar14 = *argv;
  pcVar6 = strrchr(pcVar14,0x2f);
  cmdname = pcVar6 + 1;
  if (pcVar6 == (char *)0x0) {
    cmdname = pcVar14;
  }
  iVar3 = jas_init();
  if (iVar3 != 0) {
    abort();
  }
  __ptr = cmdopts_parse(argc,argv);
  if (__ptr->version == 0) {
    jas_setdbglevel(__ptr->debug);
    if (__ptr->verbose != 0) {
      cmdinfo();
    }
    pcVar14 = "rb";
    if (__ptr->infile == (char *)0x0) {
LAB_00102701:
      uVar15 = 0;
      uVar7 = jas_stream_fdopen();
      if (uVar7 != 0) goto LAB_00102711;
      main_cold_10();
LAB_00102926:
      main_cold_9();
LAB_0010292b:
      main_cold_8();
      __ptr_00 = (void *)0x2060;
      puVar12 = (undefined8 *)malloc(0x2060);
      if (puVar12 == (undefined8 *)0x0) {
code_r0x00102040:
        cmdopts_parse_cold_5();
        free(__ptr_00);
        return extraout_EAX;
      }
      *puVar12 = 0;
      *(undefined4 *)(puVar12 + 1) = 0xffffffff;
      puVar12[2] = 0;
      *(undefined1 *)(puVar12 + 3) = 0;
      puVar12[0x204] = 0;
      piVar1 = (int *)(puVar12 + 0x205);
      *(undefined4 *)(puVar12 + 0x205) = 0xffffffff;
      puVar12[0x206] = 0;
      *(undefined1 *)(puVar12 + 0x207) = 0;
      *(undefined8 *)((long)puVar12 + 0x203c) = 0;
      *(undefined4 *)((long)puVar12 + 0x2044) = 0;
      puVar12[0x409] = 0xffffffffffffffff;
      *(undefined4 *)(puVar12 + 0x40a) = 0;
      do {
        __ptr_00 = (void *)(uVar15 & 0xffffffff);
        uVar5 = jas_getopt(__ptr_00,pcVar14,cmdopts_parse::cmdoptions);
        pcVar6 = _jas_optarg;
        switch(uVar5) {
        case 0:
          cmdusage();
          goto code_r0x00102040;
        case 1:
          *(undefined4 *)((long)puVar12 + 0x203c) = 1;
          break;
        case 2:
          *puVar12 = _jas_optarg;
          break;
        case 3:
          iVar3 = jas_image_strtofmt(_jas_optarg);
          *(int *)(puVar12 + 1) = iVar3;
          if (iVar3 < 0) {
            fprintf(_stderr,"warning: ignoring invalid input format %s\n",pcVar6);
            *(undefined4 *)(puVar12 + 1) = 0xffffffff;
          }
          break;
        case 4:
          addopt((char *)(puVar12 + 3),0x1000,_jas_optarg);
          puVar12[2] = puVar12 + 3;
          break;
        case 5:
          puVar12[0x204] = _jas_optarg;
          break;
        case 6:
          iVar3 = jas_image_strtofmt(_jas_optarg);
          *piVar1 = iVar3;
          if (iVar3 < 0) {
LAB_00102bba:
            cmdopts_parse_cold_1();
switchD_001029f6_default:
            badusage();
          }
          break;
        case 7:
          addopt((char *)(puVar12 + 0x207),0x1000,_jas_optarg);
          puVar12[0x206] = puVar12 + 0x207;
          break;
        case 8:
          *(undefined4 *)((long)puVar12 + 0x2044) = 1;
          break;
        case 9:
          iVar3 = atoi(_jas_optarg);
          *(int *)(puVar12 + 0x408) = iVar3;
          break;
        case 10:
          iVar3 = atoi(_jas_optarg);
          puVar12[0x409] = (long)iVar3;
          break;
        case 0xb:
          *(undefined4 *)(puVar12 + 0x40a) = 1;
          break;
        case 0xc:
          uVar13 = strtoull(_jas_optarg,(char **)0x0,10);
          puVar12[0x40b] = uVar13;
          break;
        case 0xffffffff:
          if (_jas_optind < (int)uVar15) {
            cmdopts_parse_cold_2();
          }
          if ((*(int *)((long)puVar12 + 0x2044) != 0) || (-1 < *piVar1)) {
LAB_00102b8a:
            return (int)puVar12;
          }
          if (puVar12[0x204] != 0) {
            iVar3 = jas_image_fmtfromname();
            *piVar1 = iVar3;
            if ((-1 < iVar3) || (cmdopts_parse_cold_3(), (extraout_RAX & 1) == 0))
            goto LAB_00102b8a;
          }
          cmdopts_parse_cold_4();
          goto LAB_00102bba;
        default:
          goto switchD_001029f6_default;
        }
      } while( true );
    }
    uVar7 = jas_stream_fopen();
    if (uVar7 == 0) {
      main_cold_2();
      goto LAB_00102701;
    }
LAB_00102711:
    pcVar14 = "w+b";
    if (__ptr->outfile == (char *)0x0) {
LAB_00102740:
      uVar15 = 1;
      lVar8 = jas_stream_fdopen();
      if (lVar8 == 0) goto LAB_00102926;
    }
    else {
      lVar8 = jas_stream_fopen();
      if (lVar8 == 0) {
        __ptr = (cmdopts_t *)&__ptr->outfile;
        main_cold_3();
        goto LAB_00102740;
      }
    }
    if (__ptr->infmt < 0) {
      uVar15 = uVar7;
      iVar3 = jas_image_getfmt();
      __ptr->infmt = iVar3;
      if (iVar3 < 0) goto LAB_0010292b;
    }
    jas_tmr_start(local_50);
    lVar9 = jas_image_decode(uVar7,__ptr->infmt,__ptr->inopts);
    if (lVar9 == 0) goto LAB_001028f1;
    jas_tmr_stop(local_50);
    uVar16 = jas_tmr_get(local_50);
    if (((-1 < __ptr->cmptno) && (__ptr->cmptno < (long)(ulong)*(uint *)(lVar9 + 0x20))) &&
       (uVar4 = *(uint *)(lVar9 + 0x20) - 1, -1 < (int)uVar4)) {
      uVar15 = (ulong)uVar4;
      do {
        if (uVar15 != __ptr->cmptno) {
          jas_image_delcmpt(lVar9,uVar15 & 0xffffffff);
        }
        bVar2 = 0 < (long)uVar15;
        uVar15 = uVar15 - 1;
      } while (bVar2);
    }
    lVar11 = lVar9;
    if (__ptr->srgb == 0) {
LAB_00102844:
      jas_tmr_start(local_70);
      iVar3 = jas_image_encode(lVar11,lVar8,__ptr->outfmt,__ptr->outopts,in_R8,in_R9,uVar16);
      if (iVar3 != 0) goto LAB_001028f6;
      jas_stream_flush(lVar8);
      jas_tmr_stop(local_70);
      jas_tmr_get(local_70);
      if (__ptr->verbose != 0) {
        main_cold_5();
      }
      jas_stream_close(uVar7);
      iVar3 = jas_stream_close(lVar8);
      if (iVar3 == 0) {
        free(__ptr);
        jas_image_destroy(lVar11);
        jas_image_clearfmts();
        return 0;
      }
      goto LAB_001028fb;
    }
    jas_eprintf("forcing conversion to sRGB\n");
    lVar10 = jas_cmprof_createfromclrspc(0x401);
    if (lVar10 != 0) {
      lVar11 = jas_image_chclrspc(lVar9,lVar10,0);
      if (lVar11 == 0) {
        pcVar14 = "cannot convert to sRGB\n";
        goto LAB_00102910;
      }
      jas_image_destroy(lVar9);
      jas_cmprof_destroy(lVar10);
      goto LAB_00102844;
    }
  }
  else {
    main_cold_1();
LAB_001028f1:
    main_cold_7();
LAB_001028f6:
    main_cold_4();
LAB_001028fb:
    main_cold_6();
  }
  pcVar14 = "cannot create sRGB profile\n";
LAB_00102910:
  jas_eprintf(pcVar14);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	jas_image_t *image;
	cmdopts_t *cmdopts;
	jas_stream_t *in;
	jas_stream_t *out;
	jas_tmr_t dectmr;
	jas_tmr_t enctmr;
	double dectime;
	double enctime;
	int_fast16_t numcmpts;
	int i;

	/* Determine the base name of this command. */
	if ((cmdname = strrchr(argv[0], '/'))) {
		++cmdname;
	} else {
		cmdname = argv[0];
	}

	if (jas_init()) {
		abort();
	}

	/* Parse the command line options. */
	if (!(cmdopts = cmdopts_parse(argc, argv))) {
		fprintf(stderr, "error: cannot parse command line\n");
		exit(EXIT_FAILURE);
	}

	if (cmdopts->version) {
		printf("%s\n", JAS_VERSION);
		fprintf(stderr, "libjasper %s\n", jas_getversion());
		exit(EXIT_SUCCESS);
	}

	jas_setdbglevel(cmdopts->debug);
#if defined(JAS_DEFAULT_MAX_MEM_USAGE)
	jas_set_max_mem_usage(cmdopts->max_mem);
#endif

	if (cmdopts->verbose) {
		cmdinfo();
	}

	/* Open the input image file. */
	if (cmdopts->infile) {
		/* The input image is to be read from a file. */
		if (!(in = jas_stream_fopen(cmdopts->infile, "rb"))) {
			fprintf(stderr, "error: cannot open input image file %s\n",
			  cmdopts->infile);
			exit(EXIT_FAILURE);
		}
	} else {
		/* The input image is to be read from standard input. */
		if (!(in = jas_stream_fdopen(0, "rb"))) {
			fprintf(stderr, "error: cannot open standard input\n");
			exit(EXIT_FAILURE);
		}
	}

	/* Open the output image file. */
	if (cmdopts->outfile) {
		/* The output image is to be written to a file. */
		if (!(out = jas_stream_fopen(cmdopts->outfile, "w+b"))) {
			fprintf(stderr, "error: cannot open output image file %s\n",
			  cmdopts->outfile);
			exit(EXIT_FAILURE);
		}
	} else {
		/* The output image is to be written to standard output. */
		if (!(out = jas_stream_fdopen(1, "w+b"))) {
			fprintf(stderr, "error: cannot open standard output\n");
			exit(EXIT_FAILURE);
		}
	}

	if (cmdopts->infmt < 0) {
		if ((cmdopts->infmt = jas_image_getfmt(in)) < 0) {
			fprintf(stderr, "error: input image has unknown format\n");
			exit(EXIT_FAILURE);
		}
	}

	/* Get the input image data. */
	jas_tmr_start(&dectmr);
	if (!(image = jas_image_decode(in, cmdopts->infmt, cmdopts->inopts))) {
		fprintf(stderr, "error: cannot load image data\n");
		exit(EXIT_FAILURE);
	}
	jas_tmr_stop(&dectmr);
	dectime = jas_tmr_get(&dectmr);

	/* If requested, throw away all of the components except one.
	  Why might this be desirable?  It is a hack, really.
	  None of the image formats other than the JPEG-2000 ones support
	  images with two, four, five, or more components.  This hack
	  allows such images to be decoded with the non-JPEG-2000 decoders,
	  one component at a time. */
	numcmpts = jas_image_numcmpts(image);
	if (cmdopts->cmptno >= 0 && cmdopts->cmptno < numcmpts) {
		for (i = numcmpts - 1; i >= 0; --i) {
			if (i != cmdopts->cmptno) {
				jas_image_delcmpt(image, i);
			}
		}
	}

	if (cmdopts->srgb) {
		jas_image_t *newimage;
		jas_cmprof_t *outprof;
		jas_eprintf("forcing conversion to sRGB\n");
		if (!(outprof = jas_cmprof_createfromclrspc(JAS_CLRSPC_SRGB))) {
			jas_eprintf("cannot create sRGB profile\n");
			exit(EXIT_FAILURE);
		}
		if (!(newimage = jas_image_chclrspc(image, outprof, JAS_CMXFORM_INTENT_PER))) {
			jas_eprintf("cannot convert to sRGB\n");
			exit(EXIT_FAILURE);
		}
		jas_image_destroy(image);
		jas_cmprof_destroy(outprof);
		image = newimage;
	}

	/* Generate the output image data. */
	jas_tmr_start(&enctmr);
	if (jas_image_encode(image, out, cmdopts->outfmt, cmdopts->outopts)) {
		fprintf(stderr, "error: cannot encode image\n");
		exit(EXIT_FAILURE);
	}
	jas_stream_flush(out);
	jas_tmr_stop(&enctmr);
	enctime = jas_tmr_get(&enctmr);

	if (cmdopts->verbose) {
		fprintf(stderr, "decoding time = %f\n", dectime);
		fprintf(stderr, "encoding time = %f\n", enctime);
	}

	/* If this fails, we don't care. */
	(void) jas_stream_close(in);

	/* Close the output image stream. */
	if (jas_stream_close(out)) {
		fprintf(stderr, "error: cannot close output image file\n");
		exit(EXIT_FAILURE);
	}

	cmdopts_destroy(cmdopts);
	jas_image_destroy(image);
	jas_image_clearfmts();

	/* Success at last! :-) */
	return EXIT_SUCCESS;
}